

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void __thiscall
UIContext::UIContext
          (UIContext *this,GraphicsContext *context,string *window_name,int width,int height)

{
  size_type *psVar1;
  function<void_(ApplicationContextBase_&)> *this_00;
  undefined8 in_RSI;
  string *in_RDI;
  function<void_(ApplicationContextBase_&)> *unaff_retaddr;
  GraphicsContext *in_stack_00000008;
  Detail *in_stack_00000010;
  
  *(undefined ***)in_RDI = &PTR___cxa_pure_virtual_002594d0;
  psVar1 = &in_RDI->_M_string_length;
  this_00 = (function<void_(ApplicationContextBase_&)> *)operator_new(0x50);
  std::function<void(ApplicationContextBase&)>::
  function<UIContext::UIContext(GraphicsContext&,std::__cxx11::string_const&,int,int)::__0,void>
            (this_00,(anon_class_8_1_8991fb9c *)this_00);
  Detail::Detail(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,
                 (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  std::function<void_(ApplicationContextBase_&)>::~function
            ((function<void_(ApplicationContextBase_&)> *)0x116209);
  *psVar1 = (size_type)this_00;
  return;
}

Assistant:

UIContext::UIContext(GraphicsContext& context,
    const std::string& window_name, int width, int height)
    : m_(new Detail(context, [this](ApplicationContextBase& ac) { Run(ac); }, window_name, width, height))
{
}